

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O0

void __thiscall bdNodeManager::doPeerCallback(bdNodeManager *this,bdId *id,uint32_t status)

{
  bool bVar1;
  reference ppBVar2;
  _Self local_38;
  _List_node_base *local_30;
  _List_iterator<BitDhtCallback_*> local_28;
  iterator it;
  uint32_t status_local;
  bdId *id_local;
  bdNodeManager *this_local;
  
  it._M_node._4_4_ = status;
  std::_List_iterator<BitDhtCallback_*>::_List_iterator(&local_28);
  local_30 = (_List_node_base *)
             std::__cxx11::list<BitDhtCallback_*,_std::allocator<BitDhtCallback_*>_>::begin
                       (&this->mCallbacks);
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<BitDhtCallback_*,_std::allocator<BitDhtCallback_*>_>::end
                   (&this->mCallbacks);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    ppBVar2 = std::_List_iterator<BitDhtCallback_*>::operator*(&local_28);
    (*(*ppBVar2)->_vptr_BitDhtCallback[1])(*ppBVar2,id,(ulong)it._M_node._4_4_);
    std::_List_iterator<BitDhtCallback_*>::operator++(&local_28,0);
  }
  return;
}

Assistant:

void bdNodeManager::doPeerCallback(const bdId *id, uint32_t status) {

#ifdef DEBUG_MGR
	std::cerr << "bdNodeManager::doPeerCallback()";
	mDhtFns->bdPrintId(std::cerr, id);
	std::cerr << "status: " << status;
	std::cerr << std::endl;
#endif

        /* search list */
        std::list<BitDhtCallback *>::iterator it;
        for (it = mCallbacks.begin(); it != mCallbacks.end(); it++) {
                (*it)->dhtPeerCallback(id, status);
        }
        return;
}